

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void __thiscall
crnlib::
hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
::swap(hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
       *this,hash_map_type *other)

{
  uint uVar1;
  
  vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
  ::swap(&this->m_values,&other->m_values);
  uVar1 = this->m_hash_shift;
  this->m_hash_shift = other->m_hash_shift;
  other->m_hash_shift = uVar1;
  uVar1 = this->m_num_valid;
  this->m_num_valid = other->m_num_valid;
  other->m_num_valid = uVar1;
  uVar1 = this->m_grow_threshold;
  this->m_grow_threshold = other->m_grow_threshold;
  other->m_grow_threshold = uVar1;
  return;
}

Assistant:

inline void swap(hash_map_type& other) {
    m_values.swap(other.m_values);
    utils::swap(m_hash_shift, other.m_hash_shift);
    utils::swap(m_num_valid, other.m_num_valid);
    utils::swap(m_grow_threshold, other.m_grow_threshold);
    utils::swap(m_hasher, other.m_hasher);
    utils::swap(m_equals, other.m_equals);
  }